

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::get_download_queue
          (torrent *this,
          vector<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
          *queue)

{
  span<const_libtorrent::aux::piece_picker::downloading_piece> q_00;
  pointer this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  pointer this_02;
  size_type sVar4;
  unsigned_long uVar5;
  torrent_info *p_00;
  vector<libtorrent::block_info,_std::allocator<libtorrent::block_info>_> *local_70;
  vector<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_> *local_68;
  piece_index_t local_4c;
  int local_48;
  uint local_44;
  int blocks_per_piece;
  vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
  q;
  piece_picker *p;
  vector<libtorrent::block_info,_std::allocator<libtorrent::block_info>_> *blk;
  vector<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
  *queue_local;
  torrent *this_local;
  vector<libtorrent::block_info,_std::allocator<libtorrent::block_info>_> *this_01;
  
  ::std::vector<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>::
  clear(queue);
  iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x41])();
  this_01 = (vector<libtorrent::block_info,_std::allocator<libtorrent::block_info>_> *)
            CONCAT44(extraout_var,iVar2);
  ::std::vector<libtorrent::block_info,_std::allocator<libtorrent::block_info>_>::clear(this_01);
  bVar1 = valid_metadata(this);
  if ((bVar1) && (bVar1 = has_picker(this), bVar1)) {
    q.
    super__Vector_base<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)picker(this);
    piece_picker::get_download_queue
              ((vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
                *)&blocks_per_piece,
               (piece_picker *)
               q.
               super__Vector_base<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar1 = ::std::
            vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
            ::empty((vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
                     *)&blocks_per_piece);
    if (!bVar1) {
      this_02 = ::std::
                unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                ::operator->(&(this->super_torrent_hot_members).m_picker);
      strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_4c,0);
      local_48 = piece_picker::blocks_in_piece(this_02,local_4c);
      sVar4 = ::std::
              vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
              ::size((vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
                      *)&blocks_per_piece);
      uVar5 = numeric_cast<unsigned_long,int,void>(local_48);
      ::std::vector<libtorrent::block_info,_std::allocator<libtorrent::block_info>_>::resize
                (this_01,sVar4 * uVar5);
      this_00 = q.
                super__Vector_base<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      p_00 = torrent_file(this);
      uVar3 = block_size(this);
      span<libtorrent::aux::piece_picker::downloading_piece_const>::
      span<std::vector<libtorrent::aux::piece_picker::downloading_piece,std::allocator<libtorrent::aux::piece_picker::downloading_piece>>,libtorrent::aux::piece_picker::downloading_piece,void>
                ((span<libtorrent::aux::piece_picker::downloading_piece_const> *)&local_70,
                 (vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
                  *)&blocks_per_piece);
      q_00.m_len = (difference_type)this_01;
      q_00.m_ptr = (downloading_piece *)queue;
      anon_unknown_135::initialize_piece_info
                ((anon_unknown_135 *)this_00,(piece_picker *)p_00,(torrent_info *)(ulong)uVar3,
                 (int)this_01,local_70,q_00,local_68);
    }
    local_44 = (uint)bVar1;
    ::std::
    vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
    ::~vector((vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
               *)&blocks_per_piece);
  }
  return;
}

Assistant:

void torrent::get_download_queue(std::vector<partial_piece_info>* queue) const
	{
		TORRENT_ASSERT(is_single_thread());
		queue->clear();
		std::vector<block_info>& blk = m_ses.block_info_storage();
		blk.clear();

		if (!valid_metadata() || !has_picker()) return;
		piece_picker const& p = picker();
		std::vector<piece_picker::downloading_piece> q
			= p.get_download_queue();
		if (q.empty()) return;

		const int blocks_per_piece = m_picker->blocks_in_piece(piece_index_t(0));
		blk.resize(q.size() * aux::numeric_cast<std::size_t>(blocks_per_piece));

		initialize_piece_info(p, torrent_file(), block_size(), blk, q, queue);
	}